

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

optional<pbrt::SquareMatrix<2>_> *
pbrt::Inverse<2>(optional<pbrt::SquareMatrix<2>_> *__return_storage_ptr__,SquareMatrix<2> *m)

{
  Float FVar1;
  undefined8 uVar2;
  int j;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  Float *pFVar9;
  ulong uVar10;
  int k;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  Float minv [2] [2];
  int ipiv [2];
  int indxr [2];
  int indxc [2];
  Float local_38 [2];
  Float aFStack_30 [2];
  uint local_28 [6];
  
  local_28[0] = 0;
  local_28[1] = 0;
  local_38 = m->m[0];
  aFStack_30 = m->m[1];
  auVar16._8_4_ = 0x7fffffff;
  auVar16._0_8_ = 0x7fffffff7fffffff;
  auVar16._12_4_ = 0x7fffffff;
  bVar14 = false;
  lVar3 = 0;
  do {
    bVar15 = false;
    auVar19 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar7 = 0;
    uVar5 = 0;
    pFVar9 = local_38;
    uVar10 = 0;
    do {
      if (local_28[uVar10] != 1) {
        uVar12 = 0;
        do {
          uVar4 = (uint)uVar5;
          uVar6 = (uint)uVar7;
          if (local_28[uVar12] == 0) {
            auVar18 = vandps_avx(ZEXT416(*(uint *)((long)pFVar9 + uVar12 * 4)),auVar16);
            if (auVar19._0_4_ <= auVar18._0_4_) {
              uVar5 = uVar10 & 0xffffffff;
              uVar7 = uVar12 & 0xffffffff;
              auVar19 = ZEXT1664(auVar18);
            }
          }
          else if (1 < (int)local_28[uVar12]) {
            *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
            *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
            *(undefined4 *)&__return_storage_ptr__->set = 0;
            goto LAB_002412ab;
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 == 1);
      }
      uVar4 = (uint)uVar5;
      uVar6 = (uint)uVar7;
      pFVar9 = (Float *)((long)pFVar9 + 8);
      bVar13 = uVar10 == 0;
      bVar15 = !bVar13;
      uVar10 = uVar10 + 1;
    } while (bVar13);
LAB_002412ab:
    if (!bVar15) {
LAB_0024139e:
      if (!bVar14) {
        return __return_storage_ptr__;
      }
      break;
    }
    lVar8 = (long)(int)uVar6;
    local_28[lVar8] = local_28[lVar8] + 1;
    if (uVar4 != uVar6) {
      lVar11 = 0;
      do {
        FVar1 = local_38[(long)(int)uVar4 * 2 + lVar11];
        local_38[(long)(int)uVar4 * 2 + lVar11] = local_38[lVar8 * 2 + lVar11];
        local_38[lVar8 * 2 + lVar11] = FVar1;
        lVar11 = lVar11 + 1;
      } while (lVar11 == 1);
    }
    local_28[lVar3 + 2] = uVar4;
    local_28[lVar3 + 4] = uVar6;
    fVar17 = local_38[lVar8 * 3];
    if ((fVar17 == 0.0) && (!NAN(fVar17))) {
      __return_storage_ptr__->optionalValue =
           (aligned_storage_t<sizeof(pbrt::SquareMatrix<2>),_alignof(pbrt::SquareMatrix<2>)>)
           (ZEXT816(0) << 0x20);
      *(undefined4 *)&__return_storage_ptr__->set = 0;
      goto LAB_0024139e;
    }
    local_38[lVar8 * 3] = 1.0;
    fVar17 = 1.0 / fVar17;
    auVar18._0_4_ = fVar17 * (float)*(undefined8 *)(local_38 + lVar8 * 2);
    auVar18._4_4_ = fVar17 * (float)((ulong)*(undefined8 *)(local_38 + lVar8 * 2) >> 0x20);
    auVar18._8_4_ = fVar17 * 0.0;
    auVar18._12_4_ = fVar17 * 0.0;
    uVar2 = vmovlps_avx(auVar18);
    *(undefined8 *)(local_38 + lVar8 * 2) = uVar2;
    pFVar9 = local_38;
    uVar10 = 0;
    do {
      if (uVar10 != uVar6) {
        FVar1 = local_38[uVar10 * 2 + lVar8];
        local_38[uVar10 * 2 + lVar8] = 0.0;
        lVar11 = 0;
        do {
          auVar18 = vfnmadd213ss_fma(ZEXT416((uint)local_38[lVar8 * 2 + lVar11]),
                                     ZEXT416((uint)FVar1),
                                     ZEXT416(*(uint *)((long)pFVar9 + lVar11 * 4)));
          *(int *)((long)pFVar9 + lVar11 * 4) = auVar18._0_4_;
          lVar11 = lVar11 + 1;
        } while (lVar11 == 1);
      }
      pFVar9 = (Float *)((long)pFVar9 + 8);
      bVar14 = uVar10 == 0;
      uVar10 = uVar10 + 1;
    } while (bVar14);
    bVar15 = lVar3 == 0;
    bVar14 = !bVar15;
    lVar3 = lVar3 + 1;
  } while (bVar15);
  lVar3 = 1;
  do {
    uVar4 = local_28[lVar3 + 2];
    uVar6 = local_28[lVar3 + 4];
    if (uVar4 != uVar6) {
      lVar8 = 0;
      do {
        FVar1 = local_38[lVar8 * 2 + (long)(int)uVar4];
        local_38[lVar8 * 2 + (long)(int)uVar4] = local_38[lVar8 * 2 + (long)(int)uVar6];
        local_38[lVar8 * 2 + (long)(int)uVar6] = FVar1;
        lVar8 = lVar8 + 1;
      } while (lVar8 == 1);
    }
    bVar14 = lVar3 != 0;
    lVar3 = lVar3 + -1;
  } while (bVar14);
  SquareMatrix<2>::SquareMatrix((SquareMatrix<2> *)__return_storage_ptr__,&local_38);
  __return_storage_ptr__->set = true;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<SquareMatrix<N>> Inverse(const SquareMatrix<N> &m) {
    int indxc[N], indxr[N];
    int ipiv[N] = {0};
    Float minv[N][N];
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j)
            minv[i][j] = m[i][j];
    for (int i = 0; i < N; i++) {
        int irow = 0, icol = 0;
        Float big = 0.f;
        // Choose pivot
        for (int j = 0; j < N; j++) {
            if (ipiv[j] != 1) {
                for (int k = 0; k < N; k++) {
                    if (ipiv[k] == 0) {
                        if (std::abs(minv[j][k]) >= big) {
                            big = std::abs(minv[j][k]);
                            irow = j;
                            icol = k;
                        }
                    } else if (ipiv[k] > 1)
                        return {};  // singular
                }
            }
        }
        ++ipiv[icol];
        // Swap rows _irow_ and _icol_ for pivot
        if (irow != icol) {
            for (int k = 0; k < N; ++k)
                pstd::swap(minv[irow][k], minv[icol][k]);
        }
        indxr[i] = irow;
        indxc[i] = icol;
        if (minv[icol][icol] == 0.f)
            return {};  // singular

        // Set $m[icol][icol]$ to one by scaling row _icol_ appropriately
        Float pivinv = 1. / minv[icol][icol];
        minv[icol][icol] = 1.;
        for (int j = 0; j < N; j++)
            minv[icol][j] *= pivinv;

        // Subtract this row from others to zero out their columns
        for (int j = 0; j < N; j++) {
            if (j != icol) {
                Float save = minv[j][icol];
                minv[j][icol] = 0;
                for (int k = 0; k < N; k++)
                    minv[j][k] = FMA(-minv[icol][k], save, minv[j][k]);
            }
        }
    }
    // Swap columns to reflect permutation
    for (int j = N - 1; j >= 0; j--) {
        if (indxr[j] != indxc[j]) {
            for (int k = 0; k < N; k++)
                pstd::swap(minv[k][indxr[j]], minv[k][indxc[j]]);
        }
    }
    return SquareMatrix<N>(minv);
}